

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  long in_FS_OFFSET;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->result->m_info).capturedExpression.m_size != 0) {
    local_38._M_dataplus._M_p._0_1_ = 0x20;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->stream,(char *)&local_38,1);
    AssertionResult::getExpression_abi_cxx11_(&local_38,this->result);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                       local_38._M_dataplus._M_p._0_1_),local_38._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,local_38._M_dataplus._M_p._0_1_));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void printOriginalExpression() const {
        if (result.hasExpression()) {
            stream << ' ' << result.getExpression();
        }
    }